

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O2

long d_string_replace_text_in_range(DString *d,size_t pos,size_t len,char *original,char *replace)

{
  size_t len_00;
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  
  if ((replace == (char *)0x0 || (original == (char *)0x0 || d == (DString *)0x0)) ||
     (uVar5 = d->currentStringLength, uVar5 < pos)) {
    lVar3 = 0;
  }
  else {
    len_00 = strlen(original);
    sVar1 = strlen(replace);
    uVar2 = len + pos;
    if (uVar5 <= len + pos) {
      uVar2 = uVar5;
    }
    if (len == 0xffffffffffffffff) {
      uVar2 = uVar5;
    }
    pcVar6 = d->str;
    pcVar4 = pcVar6 + pos;
    lVar3 = 0;
    while( true ) {
      pcVar4 = strstr(pcVar4,original);
      if ((pcVar4 == (char *)0x0) || (uVar5 = (long)pcVar4 - (long)pcVar6, uVar2 + lVar3 <= uVar5))
      break;
      d_string_erase(d,uVar5,len_00);
      d_string_insert(d,(long)pcVar4 - (long)d->str,replace);
      lVar3 = lVar3 + (sVar1 - len_00);
      pcVar6 = d->str;
      pcVar4 = pcVar6 + uVar5 + sVar1;
    }
  }
  return lVar3;
}

Assistant:

long d_string_replace_text_in_range(DString * d, size_t pos, size_t len, const char * original, const char * replace) {
	if (d && original && replace) {
		long delta = 0;		// Overall change in length

		if (pos > d->currentStringLength) {
			// Out of range
			return 0;
		}

		long len_o = strlen(original);
		long len_r = strlen(replace);
		long change = len_r - len_o;	// Change in length for each replacement

		size_t stop;

		if (len == -1) {
			stop = d->currentStringLength;
		} else {
			stop = pos + len;

			if (stop > d->currentStringLength) {
				stop = d->currentStringLength;
			}
		}

		char * match = strstr(&(d->str[pos]), original);

		while (match && (match - d->str < stop)) {
			pos = match - d->str;
			d_string_erase(d, match - d->str, len_o);
			d_string_insert(d, match - d->str, replace);

			delta += change;
			stop += change;
			match = strstr(d->str + pos + len_r, original);
		}

		return delta;
	} else {
		return 0;
	}
}